

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall xemmai::ast::t_block::f_next(t_block *this,t_block *a_next)

{
  t_block *local_20;
  t_block *local_18;
  
  local_20 = this;
  local_18 = a_next;
  std::vector<xemmai::ast::t_block*,std::allocator<xemmai::ast::t_block*>>::
  emplace_back<xemmai::ast::t_block*>
            ((vector<xemmai::ast::t_block*,std::allocator<xemmai::ast::t_block*>> *)
             &a_next->v_previouses,&local_20);
  std::vector<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>::push_back
            (&this->v_nexts,&local_18);
  return;
}

Assistant:

void f_next(t_block* a_next)
	{
		a_next->v_previouses.push_back(this);
		v_nexts.push_back(a_next);
	}